

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_compress.c
# Opt level: O3

size_t HUF_writeCTable(void *dst,size_t maxDstSize,HUF_CElt *CTable,U32 maxSymbolValue,U32 huffLog)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  char cVar22;
  char cVar23;
  uint uVar24;
  ulong uVar25;
  size_t sVar26;
  long lVar27;
  long lVar28;
  ulong wtSize;
  char *dst_00;
  undefined1 auVar29 [16];
  undefined1 in_XMM1 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  int iVar49;
  int iVar52;
  int iVar53;
  undefined1 auVar50 [16];
  int iVar54;
  undefined1 auVar51 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  int iVar68;
  int iVar72;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  BYTE bitsToWeight [13];
  BYTE huffWeight [255];
  char local_135 [269];
  
  sVar26 = 0xffffffffffffffd2;
  if (maxSymbolValue < 0x100) {
    local_135[0] = '\0';
    uVar24 = huffLog + 1;
    if (1 < uVar24) {
      lVar27 = (ulong)uVar24 - 2;
      auVar29._8_4_ = (int)lVar27;
      auVar29._0_8_ = lVar27;
      auVar29._12_4_ = (int)((ulong)lVar27 >> 0x20);
      lVar27 = 0;
      lVar28 = 0;
      do {
        auVar47._8_4_ = (int)lVar28;
        auVar47._0_8_ = lVar28;
        auVar47._12_4_ = (int)((ulong)lVar28 >> 0x20);
        auVar50 = auVar29 ^ _DAT_001b4930;
        auVar55 = (auVar47 | _DAT_001b4920) ^ _DAT_001b4930;
        iVar49 = auVar50._0_4_;
        iVar68 = -(uint)(iVar49 < auVar55._0_4_);
        iVar52 = auVar50._4_4_;
        auVar57._4_4_ = -(uint)(iVar52 < auVar55._4_4_);
        iVar53 = auVar50._8_4_;
        iVar72 = -(uint)(iVar53 < auVar55._8_4_);
        iVar54 = auVar50._12_4_;
        auVar57._12_4_ = -(uint)(iVar54 < auVar55._12_4_);
        auVar30._4_4_ = iVar68;
        auVar30._0_4_ = iVar68;
        auVar30._8_4_ = iVar72;
        auVar30._12_4_ = iVar72;
        auVar30 = pshuflw(in_XMM1,auVar30,0xe8);
        auVar56._4_4_ = -(uint)(auVar55._4_4_ == iVar52);
        auVar56._12_4_ = -(uint)(auVar55._12_4_ == iVar54);
        auVar56._0_4_ = auVar56._4_4_;
        auVar56._8_4_ = auVar56._12_4_;
        auVar39 = pshuflw(in_XMM2,auVar56,0xe8);
        auVar57._0_4_ = auVar57._4_4_;
        auVar57._8_4_ = auVar57._12_4_;
        auVar55 = pshuflw(auVar30,auVar57,0xe8);
        auVar50._8_4_ = 0xffffffff;
        auVar50._0_8_ = 0xffffffffffffffff;
        auVar50._12_4_ = 0xffffffff;
        auVar50 = (auVar55 | auVar39 & auVar30) ^ auVar50;
        auVar50 = packssdw(auVar50,auVar50);
        cVar22 = (char)huffLog;
        cVar23 = (char)lVar27;
        if ((auVar50 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          local_135[lVar28 + 1] = cVar22 + cVar23;
        }
        auVar39._4_4_ = iVar68;
        auVar39._0_4_ = iVar68;
        auVar39._8_4_ = iVar72;
        auVar39._12_4_ = iVar72;
        auVar57 = auVar56 & auVar39 | auVar57;
        auVar50 = packssdw(auVar57,auVar57);
        auVar55._8_4_ = 0xffffffff;
        auVar55._0_8_ = 0xffffffffffffffff;
        auVar55._12_4_ = 0xffffffff;
        auVar50 = packssdw(auVar50 ^ auVar55,auVar50 ^ auVar55);
        auVar50 = packsswb(auVar50,auVar50);
        if ((auVar50._0_4_ >> 8 & 1) != 0) {
          local_135[lVar28 + 2] = cVar22 + cVar23 + -1;
        }
        auVar50 = (auVar47 | _DAT_001b4910) ^ _DAT_001b4930;
        auVar40._0_4_ = -(uint)(iVar49 < auVar50._0_4_);
        auVar40._4_4_ = -(uint)(iVar52 < auVar50._4_4_);
        auVar40._8_4_ = -(uint)(iVar53 < auVar50._8_4_);
        auVar40._12_4_ = -(uint)(iVar54 < auVar50._12_4_);
        auVar58._4_4_ = auVar40._0_4_;
        auVar58._0_4_ = auVar40._0_4_;
        auVar58._8_4_ = auVar40._8_4_;
        auVar58._12_4_ = auVar40._8_4_;
        iVar68 = -(uint)(auVar50._4_4_ == iVar52);
        iVar72 = -(uint)(auVar50._12_4_ == iVar54);
        auVar10._4_4_ = iVar68;
        auVar10._0_4_ = iVar68;
        auVar10._8_4_ = iVar72;
        auVar10._12_4_ = iVar72;
        auVar69._4_4_ = auVar40._4_4_;
        auVar69._0_4_ = auVar40._4_4_;
        auVar69._8_4_ = auVar40._12_4_;
        auVar69._12_4_ = auVar40._12_4_;
        auVar50 = auVar10 & auVar58 | auVar69;
        auVar50 = packssdw(auVar50,auVar50);
        auVar1._8_4_ = 0xffffffff;
        auVar1._0_8_ = 0xffffffffffffffff;
        auVar1._12_4_ = 0xffffffff;
        auVar50 = packssdw(auVar50 ^ auVar1,auVar50 ^ auVar1);
        auVar50 = packsswb(auVar50,auVar50);
        if ((auVar50._0_4_ >> 0x10 & 1) != 0) {
          local_135[lVar28 + 3] = cVar22 + cVar23 + -2;
        }
        auVar50 = pshufhw(auVar50,auVar58,0x84);
        auVar11._4_4_ = iVar68;
        auVar11._0_4_ = iVar68;
        auVar11._8_4_ = iVar72;
        auVar11._12_4_ = iVar72;
        auVar55 = pshufhw(auVar40,auVar11,0x84);
        auVar30 = pshufhw(auVar50,auVar69,0x84);
        auVar31._8_4_ = 0xffffffff;
        auVar31._0_8_ = 0xffffffffffffffff;
        auVar31._12_4_ = 0xffffffff;
        auVar31 = (auVar30 | auVar55 & auVar50) ^ auVar31;
        auVar50 = packssdw(auVar31,auVar31);
        auVar50 = packsswb(auVar50,auVar50);
        if ((auVar50._0_4_ >> 0x18 & 1) != 0) {
          local_135[lVar28 + 4] = cVar22 + cVar23 + -3;
        }
        auVar50 = (auVar47 | _DAT_001b4900) ^ _DAT_001b4930;
        auVar41._0_4_ = -(uint)(iVar49 < auVar50._0_4_);
        auVar41._4_4_ = -(uint)(iVar52 < auVar50._4_4_);
        auVar41._8_4_ = -(uint)(iVar53 < auVar50._8_4_);
        auVar41._12_4_ = -(uint)(iVar54 < auVar50._12_4_);
        auVar12._4_4_ = auVar41._0_4_;
        auVar12._0_4_ = auVar41._0_4_;
        auVar12._8_4_ = auVar41._8_4_;
        auVar12._12_4_ = auVar41._8_4_;
        auVar55 = pshuflw(auVar69,auVar12,0xe8);
        auVar32._0_4_ = -(uint)(auVar50._0_4_ == iVar49);
        auVar32._4_4_ = -(uint)(auVar50._4_4_ == iVar52);
        auVar32._8_4_ = -(uint)(auVar50._8_4_ == iVar53);
        auVar32._12_4_ = -(uint)(auVar50._12_4_ == iVar54);
        auVar59._4_4_ = auVar32._4_4_;
        auVar59._0_4_ = auVar32._4_4_;
        auVar59._8_4_ = auVar32._12_4_;
        auVar59._12_4_ = auVar32._12_4_;
        auVar50 = pshuflw(auVar32,auVar59,0xe8);
        auVar60._4_4_ = auVar41._4_4_;
        auVar60._0_4_ = auVar41._4_4_;
        auVar60._8_4_ = auVar41._12_4_;
        auVar60._12_4_ = auVar41._12_4_;
        auVar30 = pshuflw(auVar41,auVar60,0xe8);
        auVar2._8_4_ = 0xffffffff;
        auVar2._0_8_ = 0xffffffffffffffff;
        auVar2._12_4_ = 0xffffffff;
        auVar50 = packssdw(auVar50 & auVar55,(auVar30 | auVar50 & auVar55) ^ auVar2);
        auVar50 = packsswb(auVar50,auVar50);
        if ((auVar50 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
          local_135[lVar28 + 5] = cVar22 + cVar23 + -4;
        }
        auVar13._4_4_ = auVar41._0_4_;
        auVar13._0_4_ = auVar41._0_4_;
        auVar13._8_4_ = auVar41._8_4_;
        auVar13._12_4_ = auVar41._8_4_;
        auVar60 = auVar59 & auVar13 | auVar60;
        auVar30 = packssdw(auVar60,auVar60);
        auVar3._8_4_ = 0xffffffff;
        auVar3._0_8_ = 0xffffffffffffffff;
        auVar3._12_4_ = 0xffffffff;
        auVar50 = packssdw(auVar50,auVar30 ^ auVar3);
        auVar50 = packsswb(auVar50,auVar50);
        if ((auVar50._4_2_ >> 8 & 1) != 0) {
          local_135[lVar28 + 6] = cVar22 + cVar23 + -5;
        }
        auVar50 = (auVar47 | _DAT_001b48f0) ^ _DAT_001b4930;
        auVar42._0_4_ = -(uint)(iVar49 < auVar50._0_4_);
        auVar42._4_4_ = -(uint)(iVar52 < auVar50._4_4_);
        auVar42._8_4_ = -(uint)(iVar53 < auVar50._8_4_);
        auVar42._12_4_ = -(uint)(iVar54 < auVar50._12_4_);
        auVar61._4_4_ = auVar42._0_4_;
        auVar61._0_4_ = auVar42._0_4_;
        auVar61._8_4_ = auVar42._8_4_;
        auVar61._12_4_ = auVar42._8_4_;
        iVar68 = -(uint)(auVar50._4_4_ == iVar52);
        iVar72 = -(uint)(auVar50._12_4_ == iVar54);
        auVar14._4_4_ = iVar68;
        auVar14._0_4_ = iVar68;
        auVar14._8_4_ = iVar72;
        auVar14._12_4_ = iVar72;
        auVar70._4_4_ = auVar42._4_4_;
        auVar70._0_4_ = auVar42._4_4_;
        auVar70._8_4_ = auVar42._12_4_;
        auVar70._12_4_ = auVar42._12_4_;
        auVar50 = auVar14 & auVar61 | auVar70;
        auVar50 = packssdw(auVar50,auVar50);
        auVar4._8_4_ = 0xffffffff;
        auVar4._0_8_ = 0xffffffffffffffff;
        auVar4._12_4_ = 0xffffffff;
        auVar50 = packssdw(auVar50 ^ auVar4,auVar50 ^ auVar4);
        auVar50 = packsswb(auVar50,auVar50);
        if ((auVar50 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
          local_135[lVar28 + 7] = cVar22 + cVar23 + -6;
        }
        auVar50 = pshufhw(auVar50,auVar61,0x84);
        auVar15._4_4_ = iVar68;
        auVar15._0_4_ = iVar68;
        auVar15._8_4_ = iVar72;
        auVar15._12_4_ = iVar72;
        auVar55 = pshufhw(auVar42,auVar15,0x84);
        auVar30 = pshufhw(auVar50,auVar70,0x84);
        auVar33._8_4_ = 0xffffffff;
        auVar33._0_8_ = 0xffffffffffffffff;
        auVar33._12_4_ = 0xffffffff;
        auVar33 = (auVar30 | auVar55 & auVar50) ^ auVar33;
        auVar50 = packssdw(auVar33,auVar33);
        auVar50 = packsswb(auVar50,auVar50);
        if ((auVar50._6_2_ >> 8 & 1) != 0) {
          local_135[lVar28 + 8] = cVar22 + cVar23 + -7;
        }
        auVar50 = (auVar47 | _DAT_001b4a50) ^ _DAT_001b4930;
        auVar43._0_4_ = -(uint)(iVar49 < auVar50._0_4_);
        auVar43._4_4_ = -(uint)(iVar52 < auVar50._4_4_);
        auVar43._8_4_ = -(uint)(iVar53 < auVar50._8_4_);
        auVar43._12_4_ = -(uint)(iVar54 < auVar50._12_4_);
        auVar16._4_4_ = auVar43._0_4_;
        auVar16._0_4_ = auVar43._0_4_;
        auVar16._8_4_ = auVar43._8_4_;
        auVar16._12_4_ = auVar43._8_4_;
        auVar55 = pshuflw(auVar70,auVar16,0xe8);
        auVar34._0_4_ = -(uint)(auVar50._0_4_ == iVar49);
        auVar34._4_4_ = -(uint)(auVar50._4_4_ == iVar52);
        auVar34._8_4_ = -(uint)(auVar50._8_4_ == iVar53);
        auVar34._12_4_ = -(uint)(auVar50._12_4_ == iVar54);
        auVar62._4_4_ = auVar34._4_4_;
        auVar62._0_4_ = auVar34._4_4_;
        auVar62._8_4_ = auVar34._12_4_;
        auVar62._12_4_ = auVar34._12_4_;
        auVar50 = pshuflw(auVar34,auVar62,0xe8);
        auVar63._4_4_ = auVar43._4_4_;
        auVar63._0_4_ = auVar43._4_4_;
        auVar63._8_4_ = auVar43._12_4_;
        auVar63._12_4_ = auVar43._12_4_;
        auVar30 = pshuflw(auVar43,auVar63,0xe8);
        auVar44._8_4_ = 0xffffffff;
        auVar44._0_8_ = 0xffffffffffffffff;
        auVar44._12_4_ = 0xffffffff;
        auVar44 = (auVar30 | auVar50 & auVar55) ^ auVar44;
        auVar30 = packssdw(auVar44,auVar44);
        auVar50 = packsswb(auVar50 & auVar55,auVar30);
        if ((auVar50 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          local_135[lVar28 + 9] = cVar22 + cVar23 + -8;
        }
        auVar17._4_4_ = auVar43._0_4_;
        auVar17._0_4_ = auVar43._0_4_;
        auVar17._8_4_ = auVar43._8_4_;
        auVar17._12_4_ = auVar43._8_4_;
        auVar63 = auVar62 & auVar17 | auVar63;
        auVar30 = packssdw(auVar63,auVar63);
        auVar5._8_4_ = 0xffffffff;
        auVar5._0_8_ = 0xffffffffffffffff;
        auVar5._12_4_ = 0xffffffff;
        auVar30 = packssdw(auVar30 ^ auVar5,auVar30 ^ auVar5);
        auVar50 = packsswb(auVar50,auVar30);
        if ((auVar50._8_2_ >> 8 & 1) != 0) {
          local_135[lVar28 + 10] = cVar22 + cVar23 + -9;
        }
        auVar50 = (auVar47 | _DAT_001b4a40) ^ _DAT_001b4930;
        auVar45._0_4_ = -(uint)(iVar49 < auVar50._0_4_);
        auVar45._4_4_ = -(uint)(iVar52 < auVar50._4_4_);
        auVar45._8_4_ = -(uint)(iVar53 < auVar50._8_4_);
        auVar45._12_4_ = -(uint)(iVar54 < auVar50._12_4_);
        auVar64._4_4_ = auVar45._0_4_;
        auVar64._0_4_ = auVar45._0_4_;
        auVar64._8_4_ = auVar45._8_4_;
        auVar64._12_4_ = auVar45._8_4_;
        iVar68 = -(uint)(auVar50._4_4_ == iVar52);
        iVar72 = -(uint)(auVar50._12_4_ == iVar54);
        auVar18._4_4_ = iVar68;
        auVar18._0_4_ = iVar68;
        auVar18._8_4_ = iVar72;
        auVar18._12_4_ = iVar72;
        auVar71._4_4_ = auVar45._4_4_;
        auVar71._0_4_ = auVar45._4_4_;
        auVar71._8_4_ = auVar45._12_4_;
        auVar71._12_4_ = auVar45._12_4_;
        auVar50 = auVar18 & auVar64 | auVar71;
        auVar50 = packssdw(auVar50,auVar50);
        auVar6._8_4_ = 0xffffffff;
        auVar6._0_8_ = 0xffffffffffffffff;
        auVar6._12_4_ = 0xffffffff;
        auVar50 = packssdw(auVar50 ^ auVar6,auVar50 ^ auVar6);
        auVar50 = packsswb(auVar50,auVar50);
        if ((auVar50 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
          local_135[lVar28 + 0xb] = cVar22 + cVar23 + -10;
        }
        auVar50 = pshufhw(auVar50,auVar64,0x84);
        auVar19._4_4_ = iVar68;
        auVar19._0_4_ = iVar68;
        auVar19._8_4_ = iVar72;
        auVar19._12_4_ = iVar72;
        auVar55 = pshufhw(auVar45,auVar19,0x84);
        auVar30 = pshufhw(auVar50,auVar71,0x84);
        auVar35._8_4_ = 0xffffffff;
        auVar35._0_8_ = 0xffffffffffffffff;
        auVar35._12_4_ = 0xffffffff;
        auVar35 = (auVar30 | auVar55 & auVar50) ^ auVar35;
        auVar50 = packssdw(auVar35,auVar35);
        auVar50 = packsswb(auVar50,auVar50);
        if ((auVar50._10_2_ >> 8 & 1) != 0) {
          local_135[lVar28 + 0xc] = cVar22 + cVar23 + -0xb;
        }
        auVar50 = (auVar47 | _DAT_001b4a30) ^ _DAT_001b4930;
        auVar46._0_4_ = -(uint)(iVar49 < auVar50._0_4_);
        auVar46._4_4_ = -(uint)(iVar52 < auVar50._4_4_);
        auVar46._8_4_ = -(uint)(iVar53 < auVar50._8_4_);
        auVar46._12_4_ = -(uint)(iVar54 < auVar50._12_4_);
        auVar20._4_4_ = auVar46._0_4_;
        auVar20._0_4_ = auVar46._0_4_;
        auVar20._8_4_ = auVar46._8_4_;
        auVar20._12_4_ = auVar46._8_4_;
        auVar55 = pshuflw(auVar71,auVar20,0xe8);
        auVar36._0_4_ = -(uint)(auVar50._0_4_ == iVar49);
        auVar36._4_4_ = -(uint)(auVar50._4_4_ == iVar52);
        auVar36._8_4_ = -(uint)(auVar50._8_4_ == iVar53);
        auVar36._12_4_ = -(uint)(auVar50._12_4_ == iVar54);
        auVar65._4_4_ = auVar36._4_4_;
        auVar65._0_4_ = auVar36._4_4_;
        auVar65._8_4_ = auVar36._12_4_;
        auVar65._12_4_ = auVar36._12_4_;
        auVar50 = pshuflw(auVar36,auVar65,0xe8);
        auVar66._4_4_ = auVar46._4_4_;
        auVar66._0_4_ = auVar46._4_4_;
        auVar66._8_4_ = auVar46._12_4_;
        auVar66._12_4_ = auVar46._12_4_;
        auVar30 = pshuflw(auVar46,auVar66,0xe8);
        auVar7._8_4_ = 0xffffffff;
        auVar7._0_8_ = 0xffffffffffffffff;
        auVar7._12_4_ = 0xffffffff;
        auVar50 = packssdw(auVar50 & auVar55,(auVar30 | auVar50 & auVar55) ^ auVar7);
        auVar50 = packsswb(auVar50,auVar50);
        if ((auVar50 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
          local_135[lVar28 + 0xd] = cVar22 + cVar23 + -0xc;
        }
        auVar21._4_4_ = auVar46._0_4_;
        auVar21._0_4_ = auVar46._0_4_;
        auVar21._8_4_ = auVar46._8_4_;
        auVar21._12_4_ = auVar46._8_4_;
        auVar66 = auVar65 & auVar21 | auVar66;
        auVar30 = packssdw(auVar66,auVar66);
        auVar8._8_4_ = 0xffffffff;
        auVar8._0_8_ = 0xffffffffffffffff;
        auVar8._12_4_ = 0xffffffff;
        auVar50 = packssdw(auVar50,auVar30 ^ auVar8);
        auVar50 = packsswb(auVar50,auVar50);
        if ((auVar50._12_2_ >> 8 & 1) != 0) {
          local_135[lVar28 + 0xe] = cVar22 + cVar23 + -0xd;
        }
        auVar50 = (auVar47 | _DAT_001b4a20) ^ _DAT_001b4930;
        auVar37._0_4_ = -(uint)(iVar49 < auVar50._0_4_);
        auVar37._4_4_ = -(uint)(iVar52 < auVar50._4_4_);
        auVar37._8_4_ = -(uint)(iVar53 < auVar50._8_4_);
        auVar37._12_4_ = -(uint)(iVar54 < auVar50._12_4_);
        auVar67._4_4_ = auVar37._0_4_;
        auVar67._0_4_ = auVar37._0_4_;
        auVar67._8_4_ = auVar37._8_4_;
        auVar67._12_4_ = auVar37._8_4_;
        auVar48._4_4_ = -(uint)(auVar50._4_4_ == iVar52);
        auVar48._12_4_ = -(uint)(auVar50._12_4_ == iVar54);
        auVar48._0_4_ = auVar48._4_4_;
        auVar48._8_4_ = auVar48._12_4_;
        auVar51._4_4_ = auVar37._4_4_;
        auVar51._0_4_ = auVar37._4_4_;
        auVar51._8_4_ = auVar37._12_4_;
        auVar51._12_4_ = auVar37._12_4_;
        auVar30 = auVar48 & auVar67 | auVar51;
        auVar50 = packssdw(auVar37,auVar30);
        auVar9._8_4_ = 0xffffffff;
        auVar9._0_8_ = 0xffffffffffffffff;
        auVar9._12_4_ = 0xffffffff;
        auVar50 = packssdw(auVar50 ^ auVar9,auVar50 ^ auVar9);
        auVar50 = packsswb(auVar50,auVar50);
        if ((auVar50 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
          local_135[lVar28 + 0xf] = cVar22 + cVar23 + -0xe;
        }
        auVar50 = pshufhw(auVar50,auVar67,0x84);
        auVar30 = pshufhw(auVar30,auVar48,0x84);
        in_XMM2 = auVar30 & auVar50;
        auVar50 = pshufhw(auVar50,auVar51,0x84);
        auVar38._8_4_ = 0xffffffff;
        auVar38._0_8_ = 0xffffffffffffffff;
        auVar38._12_4_ = 0xffffffff;
        auVar38 = (auVar50 | in_XMM2) ^ auVar38;
        auVar50 = packssdw(auVar38,auVar38);
        in_XMM1 = packsswb(auVar50,auVar50);
        if ((in_XMM1._14_2_ >> 8 & 1) != 0) {
          local_135[lVar28 + 0x10] = cVar22 + cVar23 + -0xf;
        }
        lVar28 = lVar28 + 0x10;
        lVar27 = lVar27 + -0x10;
      } while (-lVar27 != ((ulong)uVar24 + 0xe & 0xfffffffffffffff0));
    }
    if (maxSymbolValue == 0) {
      wtSize = 0;
    }
    else {
      wtSize = (ulong)maxSymbolValue;
      uVar25 = 0;
      do {
        local_135[uVar25 + 0xd] = local_135[CTable[uVar25].nbBits];
        uVar25 = uVar25 + 1;
      } while (wtSize != uVar25);
    }
    dst_00 = (char *)((long)dst + 1);
    sVar26 = HUF_compressWeights(dst_00,maxDstSize - 1,local_135 + 0xd,wtSize);
    if (sVar26 < 0xffffffffffffff89) {
      if (sVar26 < maxSymbolValue >> 1 && 1 < sVar26) {
        *(char *)dst = (char)sVar26;
        sVar26 = sVar26 + 1;
      }
      else {
        sVar26 = 0xffffffffffffffff;
        if (maxSymbolValue < 0x81) {
          uVar25 = (ulong)((maxSymbolValue + 1 >> 1) + 1);
          sVar26 = 0xffffffffffffffba;
          if (uVar25 <= maxDstSize) {
            *(char *)dst = (char)maxSymbolValue + '\x7f';
            local_135[wtSize + 0xd] = '\0';
            sVar26 = uVar25;
            if (maxSymbolValue != 0) {
              uVar25 = 0;
              do {
                *dst_00 = local_135[uVar25 + 0xd] * '\x10' + local_135[uVar25 + 0xe];
                uVar25 = uVar25 + 2;
                dst_00 = dst_00 + 1;
              } while (uVar25 < wtSize);
            }
          }
        }
      }
    }
  }
  return sVar26;
}

Assistant:

size_t HUF_writeCTable (void* dst, size_t maxDstSize,
                        const HUF_CElt* CTable, U32 maxSymbolValue, U32 huffLog)
{
    BYTE bitsToWeight[HUF_TABLELOG_MAX + 1];   /* precomputed conversion table */
    BYTE huffWeight[HUF_SYMBOLVALUE_MAX];
    BYTE* op = (BYTE*)dst;
    U32 n;

     /* check conditions */
    if (maxSymbolValue > HUF_SYMBOLVALUE_MAX) return ERROR(maxSymbolValue_tooLarge);

    /* convert to weight */
    bitsToWeight[0] = 0;
    for (n=1; n<huffLog+1; n++)
        bitsToWeight[n] = (BYTE)(huffLog + 1 - n);
    for (n=0; n<maxSymbolValue; n++)
        huffWeight[n] = bitsToWeight[CTable[n].nbBits];

    /* attempt weights compression by FSE */
    {   CHECK_V_F(hSize, HUF_compressWeights(op+1, maxDstSize-1, huffWeight, maxSymbolValue) );
        if ((hSize>1) & (hSize < maxSymbolValue/2)) {   /* FSE compressed */
            op[0] = (BYTE)hSize;
            return hSize+1;
    }   }

    /* write raw values as 4-bits (max : 15) */
    if (maxSymbolValue > (256-128)) return ERROR(GENERIC);   /* should not happen : likely means source cannot be compressed */
    if (((maxSymbolValue+1)/2) + 1 > maxDstSize) return ERROR(dstSize_tooSmall);   /* not enough space within dst buffer */
    op[0] = (BYTE)(128 /*special case*/ + (maxSymbolValue-1));
    huffWeight[maxSymbolValue] = 0;   /* to be sure it doesn't cause msan issue in final combination */
    for (n=0; n<maxSymbolValue; n+=2)
        op[(n/2)+1] = (BYTE)((huffWeight[n] << 4) + huffWeight[n+1]);
    return ((maxSymbolValue+1)/2) + 1;
}